

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::anon_unknown_1::applyFilenamesAsTags(IConfig *config)

{
  char *__s;
  bool bVar1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this;
  reference testCaseInfo;
  undefined1 *puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  ulong local_98;
  size_type lastDot;
  size_type lastSlash;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCase *testCase;
  iterator __end2;
  iterator __begin2;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range2;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *tests;
  IConfig *config_local;
  
  this = getAllTestCasesSorted(config);
  __end2 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(this);
  testCase = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                *)&testCase);
    if (!bVar1) break;
    testCaseInfo = __gnu_cxx::
                   __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                   ::operator*(&__end2);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&filename.field_2 + 8),&(testCaseInfo->super_TestCaseInfo).tags);
    __s = (testCaseInfo->super_TestCaseInfo).lineInfo.file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_71);
    std::allocator<char>::~allocator(&local_71);
    lastDot = std::__cxx11::string::find_last_of(local_70,0x20ab4e);
    if (lastDot != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)local_70,0);
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_70);
      *puVar2 = 0x23;
    }
    local_98 = std::__cxx11::string::find_last_of((char)local_70,0x2e);
    if (local_98 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)local_70,local_98);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&filename.field_2 + 8),(value_type *)local_70);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&filename.field_2 + 8));
    setTags(&testCaseInfo->super_TestCaseInfo,&local_b0);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    std::__cxx11::string::~string((string *)local_70);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&filename.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void applyFilenamesAsTags(Catch::IConfig const& config) {
            auto& tests = const_cast<std::vector<TestCase>&>(getAllTestCasesSorted(config));
            for (auto& testCase : tests) {
                auto tags = testCase.tags;

                std::string filename = testCase.lineInfo.file;
                auto lastSlash = filename.find_last_of("\\/");
                if (lastSlash != std::string::npos) {
                    filename.erase(0, lastSlash);
                    filename[0] = '#';
                }

                auto lastDot = filename.find_last_of('.');
                if (lastDot != std::string::npos) {
                    filename.erase(lastDot);
                }

                tags.push_back(std::move(filename));
                setTags(testCase, tags);
            }
        }